

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::While_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(While_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
             Dispatch_State *t_ss)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar4;
  Void_Type local_39;
  undefined1 local_38 [16];
  
  chaiscript::detail::Dispatch_Engine::new_scope((in_RDX->m_stack_holder)._M_data);
  while( true ) {
    bVar2 = AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
            get_scoped_bool_condition
                      ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                        *)((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock
                          .__align,in_RDX);
    if (!bVar2) break;
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               local_38,*(Dispatch_State **)
                         ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                                 _M_rwlock + 8));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    }
  }
  if (void_var()::v == '\0') {
    iVar3 = __cxa_guard_acquire(&void_var()::v);
    if (iVar3 != 0) {
      Boxed_Value::Boxed_Value<chaiscript::Boxed_Value::Void_Type,void>
                (&void_var::v,&local_39,false);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
      __cxa_guard_release(&void_var()::v);
    }
  }
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
  super_AST_Node._vptr_AST_Node =
       (_func_int **)
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node.identifier =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  chaiscript::detail::Dispatch_Engine::pop_scope((in_RDX->m_stack_holder)._M_data);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        try {
          while (this->get_scoped_bool_condition(*this->children[0], t_ss)) {
            try {
              this->children[1]->eval(t_ss);
            } catch (detail::Continue_Loop &) {
              // we got a continue exception, which means all of the remaining
              // loop implementation is skipped and we just need to continue to
              // the next condition test
            }
          }
        } catch (detail::Break_Loop &) {
          // loop was broken intentionally
        }

        return void_var();
      }